

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O2

void jpeg_fdct_7x14(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  JSAMPROW pJVar10;
  int *piVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  DCTELEM *pDVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  uint uVar24;
  long lVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  DCTELEM workspace [48];
  int local_f8 [8];
  int aiStack_d8 [8];
  int aiStack_b8 [8];
  int aiStack_98 [8];
  int aiStack_78 [8];
  int aiStack_58 [10];
  ulong uVar25;
  
  lVar29 = 0;
  memset(data,0,0x100);
  uVar12 = (ulong)start_col;
  pDVar16 = data;
  do {
    pJVar10 = sample_data[lVar29];
    uVar23 = (ulong)((uint)pJVar10[uVar12] + (uint)pJVar10[uVar12 + 6]);
    uVar24 = (uint)pJVar10[uVar12 + 1] + (uint)pJVar10[uVar12 + 5];
    uVar25 = (ulong)uVar24;
    uVar27 = (ulong)((uint)pJVar10[uVar12 + 2] + (uint)pJVar10[uVar12 + 4]);
    bVar1 = pJVar10[uVar12 + 3];
    lVar20 = (ulong)pJVar10[uVar12] - (ulong)pJVar10[uVar12 + 6];
    lVar18 = (ulong)pJVar10[uVar12 + 1] - (ulong)pJVar10[uVar12 + 5];
    lVar17 = (ulong)pJVar10[uVar12 + 2] - (ulong)pJVar10[uVar12 + 4];
    *pDVar16 = (uVar24 + bVar1 + (int)(uVar23 + uVar27)) * 4 + -0xe00;
    lVar14 = (uVar23 + uVar27 + (ulong)bVar1 * -4) * 0xb50;
    lVar13 = (uVar25 - uVar27) * 0xa12;
    pDVar16[2] = (int)(lVar13 + (uVar23 - uVar27) * 0x1d76 + lVar14 + 0x400 >> 0xb);
    lVar15 = (uVar23 - uVar25) * 0x1c37;
    pDVar16[4] = (int)(lVar13 + lVar15 + 0x400 +
                       (uVar25 - ((uint)bVar1 + (uint)bVar1)) * 0x7ffffffe95f >> 0xb);
    pDVar16[6] = (int)(lVar15 + 0x400 + (uVar23 - uVar27) * -0x1d76 + lVar14 >> 0xb);
    lVar13 = (lVar18 + lVar20) * 0x1def;
    lVar14 = (lVar17 + lVar20) * 0x13a3;
    pDVar16[1] = (int)((ulong)(lVar14 + 0x400 + (lVar20 - lVar18) * -0x573 + lVar13) >> 0xb);
    lVar15 = (lVar18 + lVar17) * -0x2c1f;
    pDVar16[3] = (int)((ulong)(lVar13 + 0x400 + (lVar20 - lVar18) * 0x573 + lVar15) >> 0xb);
    pDVar16[5] = (int)((ulong)(lVar17 * 0x3bde + lVar14 + 0x400 + lVar15) >> 0xb);
    piVar11 = local_f8;
    if ((int)lVar29 != 7) {
      if ((int)lVar29 == 0xd) {
        for (lVar29 = 0; (int)lVar29 != 7; lVar29 = lVar29 + 1) {
          iVar2 = aiStack_58[lVar29];
          iVar3 = data[lVar29];
          lVar21 = (long)(iVar2 + iVar3);
          iVar4 = aiStack_78[lVar29];
          lVar18 = (long)(iVar4 + data[lVar29 + 8]);
          iVar5 = aiStack_98[lVar29];
          iVar6 = local_f8[lVar29];
          lVar15 = (long)(iVar6 + data[lVar29 + 0x28]);
          lVar14 = (long)(data[lVar29 + 0x38] + data[lVar29 + 0x30]);
          lVar13 = lVar14 + lVar21;
          lVar21 = lVar21 - lVar14;
          lVar14 = lVar15 + lVar18;
          lVar18 = lVar18 - lVar15;
          lVar20 = (long)(data[lVar29 + 0x10] + iVar5);
          iVar7 = data[lVar29 + 0x20];
          iVar8 = aiStack_d8[lVar29];
          lVar17 = (long)(iVar8 + iVar7);
          lVar15 = lVar17 + lVar20;
          lVar20 = lVar20 - lVar17;
          iVar9 = aiStack_b8[lVar29];
          lVar17 = (long)(iVar9 + data[lVar29 + 0x18]);
          data[lVar29] = (DCTELEM)((lVar14 + lVar13 + lVar15 + lVar17) * 0x14e6 + 0x4000U >> 0xf);
          data[lVar29 + 0x20] =
               (DCTELEM)((ulong)(lVar13 * 0x1aa1 + lVar17 * -0x1000000001d90 + 0x4000 +
                                lVar15 * 0x7fffffffed93 + lVar14 * 0x694) >> 0xf);
          lVar15 = (lVar21 + lVar18) * 0x171b;
          lVar13 = (long)(iVar3 - iVar2);
          lVar28 = (long)(data[lVar29 + 8] - iVar4);
          lVar22 = (long)(data[lVar29 + 0x10] - iVar5);
          lVar14 = (long)(data[lVar29 + 0x18] - iVar9);
          lVar19 = (long)(iVar7 - iVar8);
          lVar26 = (long)(data[lVar29 + 0x28] - iVar6);
          lVar17 = (long)(data[lVar29 + 0x30] - data[lVar29 + 0x38]);
          data[lVar29 + 0x10] =
               (DCTELEM)((ulong)(lVar15 + lVar20 * 0xcd3 + 0x4000 + lVar21 * 0x5b5) >> 0xf);
          data[lVar29 + 0x30] =
               (DCTELEM)((ulong)(lVar15 + lVar20 * 0x7fffffffe330 + 0x4000 + lVar18 * 0x7fffffffdc12
                                ) >> 0xf);
          data[lVar29 + 0x38] =
               (DCTELEM)(((lVar13 + lVar14) - (lVar22 + lVar28 + (lVar26 - lVar19) + lVar17)) *
                         0x14e6 + 0x4000U >> 0xf);
          lVar18 = (lVar26 - lVar19) * 0x1d5e + lVar14 * -0x14e6 + (lVar22 + lVar28) * -0x34f;
          lVar15 = (lVar17 + lVar19) * 0xfb9 + (lVar22 + lVar13) * 0x1906;
          data[lVar29 + 0x28] =
               (DCTELEM)((ulong)(lVar19 * 0x1768 + lVar15 +
                                lVar22 * 0x7fffffffce64 + lVar18 + 0x4000) >> 0xf);
          lVar20 = (lVar26 - lVar17) * 0x9c3 + (lVar13 + lVar28) * 0x1be5;
          data[lVar29 + 0x18] =
               (DCTELEM)((ulong)(lVar26 * 0x7fffffffbfd9 + lVar20 +
                                lVar18 + lVar28 * 0x7ffffffff723 + 0x4000) >> 0xf);
          data[lVar29 + 8] =
               (DCTELEM)((ulong)(lVar15 + 0x4000 +
                                lVar13 * 0x7fffffffe873 + lVar14 * 0x14e6 + lVar17 * 0x7ffffffffd59
                                + lVar20) >> 0xf);
        }
        return;
      }
      piVar11 = pDVar16 + 8;
    }
    pDVar16 = piVar11;
    lVar29 = lVar29 + 1;
  } while( true );
}

Assistant:

GLOBAL(void)
jpeg_fdct_7x14 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3, tmp4, tmp5, tmp6;
  INT32 tmp10, tmp11, tmp12, tmp13, tmp14, tmp15, tmp16;
  INT32 z1, z2, z3;
  DCTELEM workspace[8*6];
  DCTELEM *dataptr;
  DCTELEM *wsptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Pre-zero output coefficient block. */
  MEMZERO(data, SIZEOF(DCTELEM) * DCTSIZE2);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* 7-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/14). */

  dataptr = data;
  ctr = 0;
  for (;;) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[6]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[5]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[4]);
    tmp3 = GETJSAMPLE(elemptr[3]);

    tmp10 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[6]);
    tmp11 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[5]);
    tmp12 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[4]);

    z1 = tmp0 + tmp2;
    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((z1 + tmp1 + tmp3 - 7 * CENTERJSAMPLE) << PASS1_BITS);
    tmp3 += tmp3;
    z1 -= tmp3;
    z1 -= tmp3;
    z1 = MULTIPLY(z1, FIX(0.353553391));                /* (c2+c6-c4)/2 */
    z2 = MULTIPLY(tmp0 - tmp2, FIX(0.920609002));       /* (c2+c4-c6)/2 */
    z3 = MULTIPLY(tmp1 - tmp2, FIX(0.314692123));       /* c6 */
    dataptr[2] = (DCTELEM) DESCALE(z1 + z2 + z3, CONST_BITS-PASS1_BITS);
    z1 -= z2;
    z2 = MULTIPLY(tmp0 - tmp1, FIX(0.881747734));       /* c4 */
    dataptr[4] = (DCTELEM)
      DESCALE(z2 + z3 - MULTIPLY(tmp1 - tmp3, FIX(0.707106781)), /* c2+c6-c4 */
	      CONST_BITS-PASS1_BITS);
    dataptr[6] = (DCTELEM) DESCALE(z1 + z2, CONST_BITS-PASS1_BITS);

    /* Odd part */

    tmp1 = MULTIPLY(tmp10 + tmp11, FIX(0.935414347));   /* (c3+c1-c5)/2 */
    tmp2 = MULTIPLY(tmp10 - tmp11, FIX(0.170262339));   /* (c3+c5-c1)/2 */
    tmp0 = tmp1 - tmp2;
    tmp1 += tmp2;
    tmp2 = MULTIPLY(tmp11 + tmp12, - FIX(1.378756276)); /* -c1 */
    tmp1 += tmp2;
    tmp3 = MULTIPLY(tmp10 + tmp12, FIX(0.613604268));   /* c5 */
    tmp0 += tmp3;
    tmp2 += tmp3 + MULTIPLY(tmp12, FIX(1.870828693));   /* c3+c1-c5 */

    dataptr[1] = (DCTELEM) DESCALE(tmp0, CONST_BITS-PASS1_BITS);
    dataptr[3] = (DCTELEM) DESCALE(tmp1, CONST_BITS-PASS1_BITS);
    dataptr[5] = (DCTELEM) DESCALE(tmp2, CONST_BITS-PASS1_BITS);

    ctr++;

    if (ctr != DCTSIZE) {
      if (ctr == 14)
	break;			/* Done. */
      dataptr += DCTSIZE;	/* advance pointer to next row */
    } else
      dataptr = workspace;	/* switch pointer to extended workspace */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * We must also scale the output by (8/7)*(8/14) = 32/49, which we
   * fold into the constant multipliers:
   * 14-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/28) * 32/49.
   */

  dataptr = data;
  wsptr = workspace;
  for (ctr = 0; ctr < 7; ctr++) {
    /* Even part */

    tmp0 = dataptr[DCTSIZE*0] + wsptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] + wsptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] + wsptr[DCTSIZE*3];
    tmp13 = dataptr[DCTSIZE*3] + wsptr[DCTSIZE*2];
    tmp4 = dataptr[DCTSIZE*4] + wsptr[DCTSIZE*1];
    tmp5 = dataptr[DCTSIZE*5] + wsptr[DCTSIZE*0];
    tmp6 = dataptr[DCTSIZE*6] + dataptr[DCTSIZE*7];

    tmp10 = tmp0 + tmp6;
    tmp14 = tmp0 - tmp6;
    tmp11 = tmp1 + tmp5;
    tmp15 = tmp1 - tmp5;
    tmp12 = tmp2 + tmp4;
    tmp16 = tmp2 - tmp4;

    tmp0 = dataptr[DCTSIZE*0] - wsptr[DCTSIZE*5];
    tmp1 = dataptr[DCTSIZE*1] - wsptr[DCTSIZE*4];
    tmp2 = dataptr[DCTSIZE*2] - wsptr[DCTSIZE*3];
    tmp3 = dataptr[DCTSIZE*3] - wsptr[DCTSIZE*2];
    tmp4 = dataptr[DCTSIZE*4] - wsptr[DCTSIZE*1];
    tmp5 = dataptr[DCTSIZE*5] - wsptr[DCTSIZE*0];
    tmp6 = dataptr[DCTSIZE*6] - dataptr[DCTSIZE*7];

    dataptr[DCTSIZE*0] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 + tmp11 + tmp12 + tmp13,
		       FIX(0.653061224)),                 /* 32/49 */
	      CONST_BITS+PASS1_BITS);
    tmp13 += tmp13;
    dataptr[DCTSIZE*4] = (DCTELEM)
      DESCALE(MULTIPLY(tmp10 - tmp13, FIX(0.832106052)) + /* c4 */
	      MULTIPLY(tmp11 - tmp13, FIX(0.205513223)) - /* c12 */
	      MULTIPLY(tmp12 - tmp13, FIX(0.575835255)),  /* c8 */
	      CONST_BITS+PASS1_BITS);

    tmp10 = MULTIPLY(tmp14 + tmp15, FIX(0.722074570));    /* c6 */

    dataptr[DCTSIZE*2] = (DCTELEM)
      DESCALE(tmp10 + MULTIPLY(tmp14, FIX(0.178337691))   /* c2-c6 */
	      + MULTIPLY(tmp16, FIX(0.400721155)),        /* c10 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*6] = (DCTELEM)
      DESCALE(tmp10 - MULTIPLY(tmp15, FIX(1.122795725))   /* c6+c10 */
	      - MULTIPLY(tmp16, FIX(0.900412262)),        /* c2 */
	      CONST_BITS+PASS1_BITS);

    /* Odd part */

    tmp10 = tmp1 + tmp2;
    tmp11 = tmp5 - tmp4;
    dataptr[DCTSIZE*7] = (DCTELEM)
      DESCALE(MULTIPLY(tmp0 - tmp10 + tmp3 - tmp11 - tmp6,
		       FIX(0.653061224)),                 /* 32/49 */
	      CONST_BITS+PASS1_BITS);
    tmp3  = MULTIPLY(tmp3 , FIX(0.653061224));            /* 32/49 */
    tmp10 = MULTIPLY(tmp10, - FIX(0.103406812));          /* -c13 */
    tmp11 = MULTIPLY(tmp11, FIX(0.917760839));            /* c1 */
    tmp10 += tmp11 - tmp3;
    tmp11 = MULTIPLY(tmp0 + tmp2, FIX(0.782007410)) +     /* c5 */
	    MULTIPLY(tmp4 + tmp6, FIX(0.491367823));      /* c9 */
    dataptr[DCTSIZE*5] = (DCTELEM)
      DESCALE(tmp10 + tmp11 - MULTIPLY(tmp2, FIX(1.550341076)) /* c3+c5-c13 */
	      + MULTIPLY(tmp4, FIX(0.731428202)),         /* c1+c11-c9 */
	      CONST_BITS+PASS1_BITS);
    tmp12 = MULTIPLY(tmp0 + tmp1, FIX(0.871740478)) +     /* c3 */
	    MULTIPLY(tmp5 - tmp6, FIX(0.305035186));      /* c11 */
    dataptr[DCTSIZE*3] = (DCTELEM)
      DESCALE(tmp10 + tmp12 - MULTIPLY(tmp1, FIX(0.276965844)) /* c3-c9-c13 */
	      - MULTIPLY(tmp5, FIX(2.004803435)),         /* c1+c5+c11 */
	      CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*1] = (DCTELEM)
      DESCALE(tmp11 + tmp12 + tmp3
	      - MULTIPLY(tmp0, FIX(0.735987049))          /* c3+c5-c1 */
	      - MULTIPLY(tmp6, FIX(0.082925825)),         /* c9-c11-c13 */
	      CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
    wsptr++;			/* advance pointer to next column */
  }
}